

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

bool __thiscall
(anonymous_namespace)::ExprComparator::
VisitUnary<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
          (ExprComparator *this,
          BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
          e)

{
  bool bVar1;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> BVar2;
  ExprBase in_RSI;
  ExprBase in_RDI;
  ExprBase in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  type tVar3;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *in_stack_ffffffffffffffc8;
  ExprBase other;
  
  tVar3 = (type)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  other.impl_ = *(Impl **)(in_RDI.impl_ + 2);
  mp::
  Cast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
            ((Expr)in_stack_ffffffffffffffb8.impl_);
  mp::
  BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
  ::arg((BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
         *)in_stack_ffffffffffffffb8.impl_);
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (in_stack_ffffffffffffffc8,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)other.impl_
             ,tVar3);
  BVar2 = mp::
          BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
          ::arg((BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
                 *)in_stack_ffffffffffffffb8.impl_);
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (in_stack_ffffffffffffffc8,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)other.impl_
             ,BVar2.super_ExprBase.impl_._4_4_);
  bVar1 = mp::Equal((Expr)in_RSI.impl_,(Expr)in_RDI.impl_);
  return bVar1;
}

Assistant:

bool VisitUnary(E e) {
    return Equal(Cast<E>(expr_).arg(), e.arg());
  }